

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

DataType __thiscall adios2::core::IO::InquireVariableType(IO *this,const_iterator itVariable)

{
  bool bVar1;
  pointer pVVar2;
  size_t in_RDI;
  DataType type;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>_>
  *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
  local_20 [2];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
  local_10;
  DataType local_4;
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::__detail::operator==(&local_10,local_20);
  if (bVar1) {
    local_4 = None;
  }
  else {
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_false,_true>
                  *)0x89e252);
    pVVar2 = std::
             unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>
             ::operator->((unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>
                           *)0x89e25e);
    local_4 = pVVar2->m_Type;
    if (((*(byte *)(in_RDI + 200) & 1) != 0) && (local_4 != Struct)) {
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_false,_true>
      ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_false,_true>
                    *)0x89e289);
      std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>
      ::operator->((unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>
                    *)0x89e295);
      bVar1 = VariableBase::IsValidStep
                        ((VariableBase *)CONCAT44(local_4,in_stack_ffffffffffffffd8),in_RDI);
      if (!bVar1) {
        local_4 = None;
      }
    }
  }
  return local_4;
}

Assistant:

DataType IO::InquireVariableType(const VarMap::const_iterator itVariable) const noexcept
{
    if (itVariable == m_Variables.end())
    {
        return DataType::None;
    }

    const DataType type = itVariable->second->m_Type;

    if (m_ReadStreaming)
    {
        if (type == DataType::Struct)
        {
        }
        else
        {
            if (!itVariable->second->IsValidStep(m_EngineStep + 1))
            {
                return DataType::None;
            }
        }
    }

    return type;
}